

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-optimizer.cpp
# Opt level: O0

result * baryonyx::itm::branch_optimize(result *__return_storage_ptr__,context *ctx,problem *pb)

{
  problem *pb_local;
  context *ctx_local;
  
  notice<>(ctx,"- branch-optimization starts\n");
  ::optimize(__return_storage_ptr__,ctx,pb);
  return __return_storage_ptr__;
}

Assistant:

result
branch_optimize(const baryonyx::context& ctx, const baryonyx::problem& pb)
{
    baryonyx::notice(ctx, "- branch-optimization starts\n");
    return ::optimize(ctx, pb);
}